

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O3

void __thiscall QProgressDialog::setCancelButton(QProgressDialog *this,QPushButton *cancelButton)

{
  QProgressDialogPrivate *this_00;
  QPushButton *pQVar1;
  QShortcut *this_01;
  long in_FS_OFFSET;
  Connection CStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QProgressDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  pQVar1 = this_00->cancel;
  if (pQVar1 == cancelButton) {
    if (cancelButton != (QPushButton *)0x0) {
      setCancelButton();
    }
  }
  else {
    if (pQVar1 != (QPushButton *)0x0) {
      (**(code **)(*(long *)&(pQVar1->super_QAbstractButton).super_QWidget + 0x20))();
    }
    this_00->cancel = cancelButton;
    if (cancelButton == (QPushButton *)0x0) {
      if (this_00->escapeShortcut != (QShortcut *)0x0) {
        (**(code **)(*(long *)this_00->escapeShortcut + 0x20))();
      }
      this_00->escapeShortcut = (QShortcut *)0x0;
      QProgressDialogPrivate::ensureSizeIsAtLeastSizeHint(this_00);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QProgressDialogPrivate::layout(this_00);
        return;
      }
      goto LAB_00507e32;
    }
    QObject::connect((QObject *)&CStack_38,(char *)cancelButton,(QObject *)"2clicked()",(char *)this
                     ,0x6e8826);
    QMetaObject::Connection::~Connection(&CStack_38);
    this_01 = (QShortcut *)operator_new(0x10);
    QShortcut::QShortcut(this_01,Cancel,(QObject *)this,"2canceled()",(char *)0x0,WindowShortcut);
    this_00->escapeShortcut = this_01;
    QProgressDialogPrivate::adoptChildWidget(this_00,(QWidget *)cancelButton);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_00507e32:
  __stack_chk_fail();
}

Assistant:

void QProgressDialog::setCancelButton(QPushButton *cancelButton)
{
    Q_D(QProgressDialog);
    if (d->cancel == cancelButton) {
        if (Q_UNLIKELY(cancelButton))
            qWarning("QProgressDialog::setCancelButton: Attempt to set the same button again");
        return;
    }
    delete d->cancel;
    d->cancel = cancelButton;
    if (cancelButton) {
        connect(d->cancel, SIGNAL(clicked()), this, SIGNAL(canceled()));
#ifndef QT_NO_SHORTCUT
        d->escapeShortcut = new QShortcut(QKeySequence::Cancel, this, SIGNAL(canceled()));
#endif
    } else {
#ifndef QT_NO_SHORTCUT
        delete d->escapeShortcut;
        d->escapeShortcut = nullptr;
#endif
    }
    d->adoptChildWidget(cancelButton);
}